

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

void __thiscall clickhouse::ColumnVector<signed_char>::ColumnVector(ColumnVector<signed_char> *this)

{
  TypeRef local_20;
  
  Type::CreateSimple<signed_char>();
  Column::Column(&this->super_Column,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnVector_00186388;
  (this->data_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

ColumnVector<T>::ColumnVector()
    : Column(Type::CreateSimple<T>())
{
}